

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Eltwise_x86_avx512::forward
          (Eltwise_x86_avx512 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  Mat *m;
  Mat *this_00;
  _func_int **pp_Var2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  int q;
  long lVar8;
  ulong uVar9;
  _func_int *p_Var10;
  long lVar11;
  undefined1 (*pauVar12) [64];
  long lVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  undefined1 (*pauVar17) [64];
  ulong uVar18;
  size_t b;
  float *pfVar19;
  uint *puVar20;
  int iVar21;
  float *pfVar22;
  pointer pMVar23;
  uint *puVar24;
  float *pfVar25;
  undefined4 *puVar26;
  size_t b_3;
  long lVar27;
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  float fVar31;
  undefined4 uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar35 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  
  m = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  uVar1 = m->c;
  iVar14 = m->h * m->w * m->elempack;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create_like(this_00,m,opt->blob_allocator);
  iVar15 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    pp_Var2 = this->_vptr_Eltwise_x86_avx512;
    p_Var10 = pp_Var2[-3];
    iVar15 = *(int *)(&this->field_0xd0 + (long)p_Var10);
    if (iVar15 == 0) {
      pMVar23 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar16 = 0;
      uVar18 = 0;
      if (0 < (int)uVar1) {
        uVar18 = (ulong)uVar1;
      }
      for (; uVar16 != uVar18; uVar16 = uVar16 + 1) {
        pvVar3 = m->data;
        pvVar4 = pMVar23[1].data;
        pvVar5 = this_00->data;
        lVar11 = this_00->elemsize * this_00->cstep * uVar16;
        lVar13 = pMVar23[1].elemsize * pMVar23[1].cstep * uVar16;
        lVar27 = m->elemsize * m->cstep * uVar16;
        lVar8 = 0;
        for (iVar15 = 0; iVar15 + 0xf < iVar14; iVar15 = iVar15 + 0x10) {
          auVar28 = vmulps_avx512f(*(undefined1 (*) [64])((long)pvVar4 + lVar8 + lVar13),
                                   *(undefined1 (*) [64])((long)pvVar3 + lVar8 + lVar27));
          *(undefined1 (*) [64])((long)pvVar5 + lVar8 + lVar11) = auVar28;
          lVar8 = lVar8 + 0x40;
        }
        for (; iVar15 + 7 < iVar14; iVar15 = iVar15 + 8) {
          pfVar19 = (float *)((long)pvVar4 + lVar8 + lVar13);
          pfVar22 = (float *)((long)pvVar3 + lVar8 + lVar27);
          auVar6._4_4_ = pfVar19[1] * pfVar22[1];
          auVar6._0_4_ = *pfVar19 * *pfVar22;
          auVar6._8_4_ = pfVar19[2] * pfVar22[2];
          auVar6._12_4_ = pfVar19[3] * pfVar22[3];
          auVar6._16_4_ = pfVar19[4] * pfVar22[4];
          auVar6._20_4_ = pfVar19[5] * pfVar22[5];
          auVar6._24_4_ = pfVar19[6] * pfVar22[6];
          auVar6._28_4_ = pfVar19[7];
          *(undefined1 (*) [32])((long)pvVar5 + lVar8 + lVar11) = auVar6;
          lVar8 = lVar8 + 0x20;
        }
        for (; iVar15 + 3 < iVar14; iVar15 = iVar15 + 4) {
          pfVar19 = (float *)((long)pvVar4 + lVar8 + lVar13);
          pfVar22 = (float *)((long)pvVar3 + lVar8 + lVar27);
          auVar33._0_4_ = *pfVar19 * *pfVar22;
          auVar33._4_4_ = pfVar19[1] * pfVar22[1];
          auVar33._8_4_ = pfVar19[2] * pfVar22[2];
          auVar33._12_4_ = pfVar19[3] * pfVar22[3];
          *(undefined1 (*) [16])((long)pvVar5 + lVar8 + lVar11) = auVar33;
          lVar8 = lVar8 + 0x10;
        }
        pfVar25 = (float *)((long)pvVar5 + lVar11 + lVar8);
        pfVar22 = (float *)((long)pvVar4 + lVar13 + lVar8);
        pfVar19 = (float *)((long)pvVar3 + lVar27 + lVar8);
        for (; iVar15 < iVar14; iVar15 = iVar15 + 1) {
          *pfVar25 = *pfVar22 * *pfVar19;
          pfVar19 = pfVar19 + 1;
          pfVar22 = pfVar22 + 1;
          pfVar25 = pfVar25 + 1;
        }
      }
      for (uVar16 = 2;
          pMVar23 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start,
          uVar16 < (ulong)(((long)(bottom_blobs->
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                                  .super__Vector_impl_data._M_finish - (long)pMVar23) / 0x48);
          uVar16 = uVar16 + 1) {
        pMVar23 = pMVar23 + uVar16;
        for (uVar9 = 0; uVar9 != uVar18; uVar9 = uVar9 + 1) {
          pauVar12 = (undefined1 (*) [64])
                     (pMVar23->cstep * uVar9 * pMVar23->elemsize + (long)pMVar23->data);
          pauVar17 = (undefined1 (*) [64])
                     (this_00->cstep * uVar9 * this_00->elemsize + (long)this_00->data);
          for (iVar15 = 0; iVar15 + 0xf < iVar14; iVar15 = iVar15 + 0x10) {
            auVar28 = vmulps_avx512f(*pauVar12,*pauVar17);
            *pauVar17 = auVar28;
            pauVar12 = pauVar12 + 1;
            pauVar17 = pauVar17 + 1;
          }
          for (; iVar15 + 7 < iVar14; iVar15 = iVar15 + 8) {
            auVar7._4_4_ = *(float *)(*pauVar12 + 4) * *(float *)(*pauVar17 + 4);
            auVar7._0_4_ = *(float *)*pauVar12 * *(float *)*pauVar17;
            auVar7._8_4_ = *(float *)(*pauVar12 + 8) * *(float *)(*pauVar17 + 8);
            auVar7._12_4_ = *(float *)(*pauVar12 + 0xc) * *(float *)(*pauVar17 + 0xc);
            auVar7._16_4_ = *(float *)(*pauVar12 + 0x10) * *(float *)(*pauVar17 + 0x10);
            auVar7._20_4_ = *(float *)(*pauVar12 + 0x14) * *(float *)(*pauVar17 + 0x14);
            auVar7._24_4_ = *(float *)(*pauVar12 + 0x18) * *(float *)(*pauVar17 + 0x18);
            auVar7._28_4_ = *(undefined4 *)(*pauVar12 + 0x1c);
            *(undefined1 (*) [32])*pauVar17 = auVar7;
            pauVar12 = (undefined1 (*) [64])(*pauVar12 + 0x20);
            pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x20);
          }
          for (; iVar15 + 3 < iVar14; iVar15 = iVar15 + 4) {
            auVar34._0_4_ = *(float *)*pauVar12 * *(float *)*pauVar17;
            auVar34._4_4_ = *(float *)(*pauVar12 + 4) * *(float *)(*pauVar17 + 4);
            auVar34._8_4_ = *(float *)(*pauVar12 + 8) * *(float *)(*pauVar17 + 8);
            auVar34._12_4_ = *(float *)(*pauVar12 + 0xc) * *(float *)(*pauVar17 + 0xc);
            *(undefined1 (*) [16])*pauVar17 = auVar34;
            pauVar12 = (undefined1 (*) [64])(*pauVar12 + 0x10);
            pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x10);
          }
          lVar8 = 0;
          for (; iVar15 < iVar14; iVar15 = iVar15 + 1) {
            *(float *)(*pauVar17 + lVar8) =
                 *(float *)(*pauVar17 + lVar8) * *(float *)(*pauVar12 + lVar8);
            lVar8 = lVar8 + 4;
          }
        }
      }
      p_Var10 = pp_Var2[-3];
      iVar15 = *(int *)(&this->field_0xd0 + (long)p_Var10);
    }
    if (iVar15 == 1) {
      pMVar23 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (*(int *)(&this->field_0x104 + (long)p_Var10) == 0) {
        uVar18 = 0;
        uVar16 = 0;
        if (0 < (int)uVar1) {
          uVar16 = (ulong)uVar1;
        }
        for (; uVar18 != uVar16; uVar18 = uVar18 + 1) {
          pvVar3 = m->data;
          pvVar4 = pMVar23[1].data;
          pvVar5 = this_00->data;
          lVar8 = this_00->elemsize * this_00->cstep * uVar18;
          lVar13 = pMVar23[1].elemsize * pMVar23[1].cstep * uVar18;
          lVar11 = m->elemsize * m->cstep * uVar18;
          lVar27 = 0;
          for (iVar15 = 0; iVar15 + 0xf < iVar14; iVar15 = iVar15 + 0x10) {
            auVar28 = vaddps_avx512f(*(undefined1 (*) [64])((long)pvVar4 + lVar27 + lVar13),
                                     *(undefined1 (*) [64])((long)pvVar3 + lVar27 + lVar11));
            *(undefined1 (*) [64])((long)pvVar5 + lVar27 + lVar8) = auVar28;
            lVar27 = lVar27 + 0x40;
          }
          for (; iVar15 + 7 < iVar14; iVar15 = iVar15 + 8) {
            pfVar19 = (float *)((long)pvVar4 + lVar27 + lVar13);
            pfVar22 = (float *)((long)pvVar3 + lVar27 + lVar11);
            auVar38._0_4_ = *pfVar19 + *pfVar22;
            auVar38._4_4_ = pfVar19[1] + pfVar22[1];
            auVar38._8_4_ = pfVar19[2] + pfVar22[2];
            auVar38._12_4_ = pfVar19[3] + pfVar22[3];
            auVar38._16_4_ = pfVar19[4] + pfVar22[4];
            auVar38._20_4_ = pfVar19[5] + pfVar22[5];
            auVar38._24_4_ = pfVar19[6] + pfVar22[6];
            auVar38._28_4_ = pfVar19[7] + pfVar22[7];
            *(undefined1 (*) [32])((long)pvVar5 + lVar27 + lVar8) = auVar38;
            lVar27 = lVar27 + 0x20;
          }
          for (; iVar15 + 3 < iVar14; iVar15 = iVar15 + 4) {
            pfVar19 = (float *)((long)pvVar4 + lVar27 + lVar13);
            pfVar22 = (float *)((long)pvVar3 + lVar27 + lVar11);
            auVar36._0_4_ = *pfVar19 + *pfVar22;
            auVar36._4_4_ = pfVar19[1] + pfVar22[1];
            auVar36._8_4_ = pfVar19[2] + pfVar22[2];
            auVar36._12_4_ = pfVar19[3] + pfVar22[3];
            *(undefined1 (*) [16])((long)pvVar5 + lVar27 + lVar8) = auVar36;
            lVar27 = lVar27 + 0x10;
          }
          pfVar25 = (float *)((long)pvVar5 + lVar8 + lVar27);
          pfVar22 = (float *)((long)pvVar4 + lVar13 + lVar27);
          pfVar19 = (float *)((long)pvVar3 + lVar11 + lVar27);
          for (; iVar15 < iVar14; iVar15 = iVar15 + 1) {
            *pfVar25 = *pfVar22 + *pfVar19;
            pfVar19 = pfVar19 + 1;
            pfVar22 = pfVar22 + 1;
            pfVar25 = pfVar25 + 1;
          }
        }
        for (uVar18 = 2;
            pMVar23 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start,
            uVar18 < (ulong)(((long)(bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar23) /
                            0x48); uVar18 = uVar18 + 1) {
          pMVar23 = pMVar23 + uVar18;
          for (uVar9 = 0; uVar9 != uVar16; uVar9 = uVar9 + 1) {
            pauVar12 = (undefined1 (*) [64])
                       (pMVar23->cstep * uVar9 * pMVar23->elemsize + (long)pMVar23->data);
            pauVar17 = (undefined1 (*) [64])
                       (this_00->cstep * uVar9 * this_00->elemsize + (long)this_00->data);
            for (iVar15 = 0; iVar15 + 0xf < iVar14; iVar15 = iVar15 + 0x10) {
              auVar28 = vaddps_avx512f(*pauVar12,*pauVar17);
              *pauVar17 = auVar28;
              pauVar12 = pauVar12 + 1;
              pauVar17 = pauVar17 + 1;
            }
            for (; iVar15 + 7 < iVar14; iVar15 = iVar15 + 8) {
              auVar39._0_4_ = *(float *)*pauVar12 + *(float *)*pauVar17;
              auVar39._4_4_ = *(float *)(*pauVar12 + 4) + *(float *)(*pauVar17 + 4);
              auVar39._8_4_ = *(float *)(*pauVar12 + 8) + *(float *)(*pauVar17 + 8);
              auVar39._12_4_ = *(float *)(*pauVar12 + 0xc) + *(float *)(*pauVar17 + 0xc);
              auVar39._16_4_ = *(float *)(*pauVar12 + 0x10) + *(float *)(*pauVar17 + 0x10);
              auVar39._20_4_ = *(float *)(*pauVar12 + 0x14) + *(float *)(*pauVar17 + 0x14);
              auVar39._24_4_ = *(float *)(*pauVar12 + 0x18) + *(float *)(*pauVar17 + 0x18);
              auVar39._28_4_ = *(float *)(*pauVar12 + 0x1c) + *(float *)(*pauVar17 + 0x1c);
              *(undefined1 (*) [32])*pauVar17 = auVar39;
              pauVar12 = (undefined1 (*) [64])(*pauVar12 + 0x20);
              pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x20);
            }
            for (; iVar15 + 3 < iVar14; iVar15 = iVar15 + 4) {
              auVar37._0_4_ = *(float *)*pauVar12 + *(float *)*pauVar17;
              auVar37._4_4_ = *(float *)(*pauVar12 + 4) + *(float *)(*pauVar17 + 4);
              auVar37._8_4_ = *(float *)(*pauVar12 + 8) + *(float *)(*pauVar17 + 8);
              auVar37._12_4_ = *(float *)(*pauVar12 + 0xc) + *(float *)(*pauVar17 + 0xc);
              *(undefined1 (*) [16])*pauVar17 = auVar37;
              pauVar12 = (undefined1 (*) [64])(*pauVar12 + 0x10);
              pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x10);
            }
            lVar8 = 0;
            for (; iVar15 < iVar14; iVar15 = iVar15 + 1) {
              *(float *)(*pauVar17 + lVar8) =
                   *(float *)(*pauVar17 + lVar8) + *(float *)(*pauVar12 + lVar8);
              lVar8 = lVar8 + 4;
            }
          }
        }
      }
      else {
        pp_Var2 = this->_vptr_Eltwise_x86_avx512;
        uVar18 = 0;
        uVar16 = 0;
        if (0 < (int)uVar1) {
          uVar16 = (ulong)uVar1;
        }
        for (; uVar18 != uVar16; uVar18 = uVar18 + 1) {
          pvVar3 = m->data;
          pvVar4 = pMVar23[1].data;
          pvVar5 = this_00->data;
          uVar9 = **(ulong **)(&this->field_0xd8 + (long)pp_Var2[-3]);
          auVar35._8_8_ = 0;
          auVar35._0_8_ = uVar9;
          auVar28 = vbroadcastss_avx512f(auVar35);
          auVar33 = vmovshdup_avx(auVar35);
          auVar29 = vbroadcastsd_avx512f(auVar33);
          lVar13 = this_00->elemsize * this_00->cstep * uVar18;
          lVar11 = pMVar23[1].elemsize * pMVar23[1].cstep * uVar18;
          lVar27 = m->elemsize * m->cstep * uVar18;
          lVar8 = 0;
          for (iVar15 = 0; iVar15 + 0xf < iVar14; iVar15 = iVar15 + 0x10) {
            auVar30 = vmulps_avx512f(auVar28,*(undefined1 (*) [64])((long)pvVar3 + lVar8 + lVar27));
            auVar30 = vfmadd231ps_avx512f(auVar30,auVar29,
                                          *(undefined1 (*) [64])((long)pvVar4 + lVar8 + lVar11));
            *(undefined1 (*) [64])((long)pvVar5 + lVar8 + lVar13) = auVar30;
            lVar8 = lVar8 + 0x40;
          }
          fVar31 = (float)uVar9;
          auVar42._0_8_ = auVar33._0_8_;
          auVar42._8_8_ = auVar42._0_8_;
          auVar42._16_8_ = auVar42._0_8_;
          auVar42._24_8_ = auVar42._0_8_;
          for (; iVar15 + 7 < iVar14; iVar15 = iVar15 + 8) {
            pfVar19 = (float *)((long)pvVar3 + lVar8 + lVar27);
            auVar28._0_4_ = fVar31 * *pfVar19;
            auVar28._4_4_ = fVar31 * pfVar19[1];
            auVar28._8_4_ = fVar31 * pfVar19[2];
            auVar28._12_4_ = fVar31 * pfVar19[3];
            auVar28._16_4_ = fVar31 * pfVar19[4];
            auVar28._20_4_ = fVar31 * pfVar19[5];
            auVar28._28_36_ = auVar29._28_36_;
            auVar28._24_4_ = fVar31 * pfVar19[6];
            auVar33 = vfmadd231ps_fma(auVar28._0_32_,auVar42,
                                      *(undefined1 (*) [32])((long)pvVar4 + lVar8 + lVar11));
            auVar29 = ZEXT1664(auVar33);
            *(undefined1 (*) [32])((long)pvVar5 + lVar8 + lVar13) = ZEXT1632(auVar33);
            lVar8 = lVar8 + 0x20;
          }
          auVar33 = vshufps_avx(auVar35,auVar35,0x55);
          for (; iVar15 + 3 < iVar14; iVar15 = iVar15 + 4) {
            pfVar19 = (float *)((long)pvVar3 + lVar8 + lVar27);
            auVar44._0_4_ = fVar31 * *pfVar19;
            auVar44._4_4_ = fVar31 * pfVar19[1];
            auVar44._8_4_ = fVar31 * pfVar19[2];
            auVar44._12_4_ = fVar31 * pfVar19[3];
            auVar34 = vfmadd231ps_fma(auVar44,auVar33,
                                      *(undefined1 (*) [16])((long)pvVar4 + lVar8 + lVar11));
            *(undefined1 (*) [16])((long)pvVar5 + lVar8 + lVar13) = auVar34;
            lVar8 = lVar8 + 0x10;
          }
          puVar26 = (undefined4 *)((long)pvVar5 + lVar13 + lVar8);
          puVar24 = (uint *)((long)pvVar4 + lVar11 + lVar8);
          puVar20 = (uint *)((long)pvVar3 + lVar27 + lVar8);
          for (; iVar15 < iVar14; iVar15 = iVar15 + 1) {
            auVar33 = vinsertps_avx(ZEXT416(*puVar20),ZEXT416(*puVar24),0x10);
            auVar40._0_4_ = auVar33._0_4_ * fVar31;
            auVar40._4_4_ = auVar33._4_4_ * (float)(uVar9 >> 0x20);
            auVar40._8_4_ = auVar33._8_4_ * 0.0;
            auVar40._12_4_ = auVar33._12_4_ * 0.0;
            auVar33 = vhaddps_avx(auVar40,auVar40);
            *puVar26 = auVar33._0_4_;
            puVar20 = puVar20 + 1;
            puVar24 = puVar24 + 1;
            puVar26 = puVar26 + 1;
          }
        }
        for (uVar18 = 2;
            pMVar23 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start,
            uVar18 < (ulong)(((long)(bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar23) /
                            0x48); uVar18 = uVar18 + 1) {
          pMVar23 = pMVar23 + uVar18;
          pp_Var2 = this->_vptr_Eltwise_x86_avx512;
          for (uVar9 = 0; uVar9 != uVar16; uVar9 = uVar9 + 1) {
            pauVar12 = (undefined1 (*) [64])
                       (pMVar23->cstep * uVar9 * pMVar23->elemsize + (long)pMVar23->data);
            pauVar17 = (undefined1 (*) [64])
                       (this_00->cstep * uVar9 * this_00->elemsize + (long)this_00->data);
            auVar28 = vbroadcastss_avx512f
                                (ZEXT416(*(uint *)(*(long *)(&this->field_0xd8 + (long)pp_Var2[-3])
                                                  + uVar18 * 4)));
            for (iVar15 = 0; iVar15 + 0xf < iVar14; iVar15 = iVar15 + 0x10) {
              auVar29 = vfmadd213ps_avx512f(*pauVar12,auVar28,*pauVar17);
              *pauVar17 = auVar29;
              pauVar12 = pauVar12 + 1;
              pauVar17 = pauVar17 + 1;
            }
            uVar32 = auVar28._0_4_;
            auVar43._4_4_ = uVar32;
            auVar43._0_4_ = uVar32;
            auVar43._8_4_ = uVar32;
            auVar43._12_4_ = uVar32;
            auVar43._16_4_ = uVar32;
            auVar43._20_4_ = uVar32;
            auVar43._24_4_ = uVar32;
            auVar43._28_4_ = uVar32;
            for (; iVar15 + 7 < iVar14; iVar15 = iVar15 + 8) {
              auVar33 = vfmadd213ps_fma(*(undefined1 (*) [32])*pauVar12,auVar43,
                                        *(undefined1 (*) [32])*pauVar17);
              *(undefined1 (*) [32])*pauVar17 = ZEXT1632(auVar33);
              pauVar12 = (undefined1 (*) [64])(*pauVar12 + 0x20);
              pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x20);
            }
            auVar41._4_4_ = uVar32;
            auVar41._0_4_ = uVar32;
            auVar41._8_4_ = uVar32;
            auVar41._12_4_ = uVar32;
            for (; iVar15 + 3 < iVar14; iVar15 = iVar15 + 4) {
              auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])*pauVar12,auVar41,
                                        *(undefined1 (*) [16])*pauVar17);
              *(undefined1 (*) [16])*pauVar17 = auVar33;
              pauVar12 = (undefined1 (*) [64])(*pauVar12 + 0x10);
              pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x10);
            }
            lVar8 = 0;
            for (; iVar15 < iVar14; iVar15 = iVar15 + 1) {
              auVar33 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar12 + lVar8)),auVar28._0_16_,
                                        ZEXT416(*(uint *)(*pauVar17 + lVar8)));
              *(int *)(*pauVar17 + lVar8) = auVar33._0_4_;
              lVar8 = lVar8 + 4;
            }
          }
        }
      }
    }
    iVar15 = 0;
    if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Eltwise_x86_avx512[-3]) == 2) {
      pMVar23 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar18 = 0;
      uVar16 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar16 = uVar18;
      }
      for (; uVar9 = 2, uVar18 != uVar16; uVar18 = uVar18 + 1) {
        pvVar3 = m->data;
        pvVar4 = pMVar23[1].data;
        pvVar5 = this_00->data;
        lVar8 = m->elemsize * m->cstep * uVar18;
        lVar13 = pMVar23[1].elemsize * pMVar23[1].cstep * uVar18;
        lVar11 = this_00->elemsize * this_00->cstep * uVar18;
        lVar27 = 0;
        for (iVar15 = 0; iVar15 + 0xf < iVar14; iVar15 = iVar15 + 0x10) {
          auVar28 = vmaxps_avx512f(*(undefined1 (*) [64])((long)pvVar3 + lVar27 + lVar8),
                                   *(undefined1 (*) [64])((long)pvVar4 + lVar27 + lVar13));
          *(undefined1 (*) [64])((long)pvVar5 + lVar27 + lVar11) = auVar28;
          lVar27 = lVar27 + 0x40;
        }
        for (; iVar15 + 7 < iVar14; iVar15 = iVar15 + 8) {
          auVar6 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar3 + lVar27 + lVar8),
                              *(undefined1 (*) [32])((long)pvVar4 + lVar27 + lVar13));
          *(undefined1 (*) [32])((long)pvVar5 + lVar27 + lVar11) = auVar6;
          lVar27 = lVar27 + 0x20;
        }
        for (; iVar15 + 3 < iVar14; iVar15 = iVar15 + 4) {
          auVar33 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar3 + lVar27 + lVar8),
                               *(undefined1 (*) [16])((long)pvVar4 + lVar27 + lVar13));
          *(undefined1 (*) [16])((long)pvVar5 + lVar27 + lVar11) = auVar33;
          lVar27 = lVar27 + 0x10;
        }
        puVar20 = (uint *)((long)pvVar3 + lVar8 + lVar27);
        puVar24 = (uint *)((long)pvVar4 + lVar13 + lVar27);
        puVar26 = (undefined4 *)((long)pvVar5 + lVar11 + lVar27);
        for (; iVar15 < iVar14; iVar15 = iVar15 + 1) {
          auVar33 = vmaxss_avx(ZEXT416(*puVar24),ZEXT416(*puVar20));
          *puVar26 = auVar33._0_4_;
          puVar20 = puVar20 + 1;
          puVar24 = puVar24 + 1;
          puVar26 = puVar26 + 1;
        }
      }
      iVar15 = 0;
      for (; pMVar23 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start,
          uVar9 < (ulong)(((long)(bottom_blobs->
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pMVar23) / 0x48);
          uVar9 = uVar9 + 1) {
        pMVar23 = pMVar23 + uVar9;
        for (uVar18 = 0; uVar18 != uVar16; uVar18 = uVar18 + 1) {
          pauVar12 = (undefined1 (*) [64])
                     (pMVar23->cstep * uVar18 * pMVar23->elemsize + (long)pMVar23->data);
          pauVar17 = (undefined1 (*) [64])
                     (this_00->cstep * uVar18 * this_00->elemsize + (long)this_00->data);
          for (iVar21 = 0; iVar21 + 0xf < iVar14; iVar21 = iVar21 + 0x10) {
            auVar28 = vmaxps_avx512f(*pauVar17,*pauVar12);
            *pauVar17 = auVar28;
            pauVar12 = pauVar12 + 1;
            pauVar17 = pauVar17 + 1;
          }
          for (; iVar21 + 7 < iVar14; iVar21 = iVar21 + 8) {
            auVar6 = vmaxps_avx(*(undefined1 (*) [32])*pauVar17,*(undefined1 (*) [32])*pauVar12);
            *(undefined1 (*) [32])*pauVar17 = auVar6;
            pauVar12 = (undefined1 (*) [64])(*pauVar12 + 0x20);
            pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x20);
          }
          for (; iVar21 + 3 < iVar14; iVar21 = iVar21 + 4) {
            auVar33 = vmaxps_avx(*(undefined1 (*) [16])*pauVar17,*(undefined1 (*) [16])*pauVar12);
            *(undefined1 (*) [16])*pauVar17 = auVar33;
            pauVar12 = (undefined1 (*) [64])(*pauVar12 + 0x10);
            pauVar17 = (undefined1 (*) [64])(*pauVar17 + 0x10);
          }
          lVar8 = 0;
          for (; iVar21 < iVar14; iVar21 = iVar21 + 1) {
            auVar33 = vmaxss_avx(ZEXT416(*(uint *)(*pauVar17 + lVar8)),
                                 ZEXT416(*(uint *)(*pauVar12 + lVar8)));
            *(int *)(*pauVar17 + lVar8) = auVar33._0_4_;
            lVar8 = lVar8 + 4;
          }
        }
      }
    }
  }
  return iVar15;
}

Assistant:

int Eltwise_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;
    int size = w * h * elempack;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_mul_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_mul_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_mul_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = *ptr * *ptr1;

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_mul_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr *= *ptr;

                    ptr++;
                    outptr++;
                }
            }
        }
    }
    if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_add_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_add_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_add_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr + *ptr1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_p, _p1);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_add_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_add_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                const float coeff0 = coeffs[0];
                const float coeff1 = coeffs[1];

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _coeff0_avx512 = _mm512_set1_ps(coeff0);
                __m512 _coeff1_avx512 = _mm512_set1_ps(coeff1);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_mul_ps(_p, _coeff0_avx512);
                    _p = _mm512_fmadd_ps(_p1, _coeff1_avx512, _p);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                __m256 _coeff0_avx = _mm256_set1_ps(coeff0);
                __m256 _coeff1_avx = _mm256_set1_ps(coeff1);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_mul_ps(_p, _coeff0_avx);
                    _p = _mm256_comp_fmadd_ps(_p1, _coeff1_avx, _p);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                __m128 _coeff0 = _mm_set1_ps(coeff0);
                __m128 _coeff1 = _mm_set1_ps(coeff1);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_mul_ps(_p, _coeff0);
                    _p1 = _mm_mul_ps(_p1, _coeff1);
                    _p = _mm_add_ps(_p1, _p);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr * coeff0 + *ptr1 * coeff1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    const float coeff = coeffs[b];

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _coeff_avx512 = _mm512_set1_ps(coeff);
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_fmadd_ps(_p1, _coeff_avx512, _p);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _coeff_avx = _mm256_set1_ps(coeff);
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p1, _coeff_avx, _p);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    __m128 _coeff = _mm_set1_ps(coeff);
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p1 = _mm_load_ps(ptr);
                        __m128 _p = _mm_load_ps(outptr);
                        _p1 = _mm_mul_ps(_p1, _coeff);
                        _p = _mm_add_ps(_p1, _p);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr * coeff;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
    }
    if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_max_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_max_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_max_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = std::max(*ptr, *ptr1);

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_max_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_max_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_max_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = std::max(*ptr, *outptr);

                    ptr++;
                    outptr++;
                }
            }
        }
    }

    return 0;
}